

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O2

string * __thiscall
duckdb::PragmaTableInfo_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  const_reference this_00;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,"SELECT * FROM pragma_table_info(%s);",&local_71);
  this_00 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)context,0);
  Value::ToString_abi_cxx11_(&local_70,this_00);
  KeywordHelper::WriteQuoted(&local_50,&local_70,'\'');
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_30,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)parameters);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

string PragmaTableInfo(ClientContext &context, const FunctionParameters &parameters) {
	return StringUtil::Format("SELECT * FROM pragma_table_info(%s);",
	                          KeywordHelper::WriteQuoted(parameters.values[0].ToString(), '\''));
}